

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImPlotRange *pIVar1;
  unsigned_long_long uVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterYs<unsigned_long_long> *pGVar8;
  TransformerLinLog *pTVar9;
  GetterYRef *pGVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [12];
  ImPlotContext *pIVar18;
  ImPlotContext *pIVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  pIVar18 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar20 = pGVar8->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar8->Ys +
           (long)(((prim + pGVar8->Offset) % iVar20 + iVar20) % iVar20) * (long)pGVar8->Stride);
  dVar3 = pGVar8->XScale;
  dVar4 = pGVar8->X0;
  dVar14 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  pIVar19 = GImPlot;
  iVar20 = pTVar9->YAxis;
  pIVar1 = &pIVar18->CurrentPlot->YAxis[iVar20].Range;
  dVar15 = pIVar1->Min;
  pGVar10 = this->Getter2;
  pTVar9 = this->Transformer;
  IVar5 = pIVar18->PixelRange[iVar20].Min;
  fVar23 = (float)(pIVar18->My[iVar20] *
                   ((dVar15 + (double)(float)(dVar14 / pIVar18->LogDenY[iVar20]) *
                              (pIVar1->Max - dVar15)) - dVar15) + (double)IVar5.y);
  fVar24 = (float)(pIVar18->Mx *
                   ((dVar4 + (double)prim * dVar3) - (pIVar18->CurrentPlot->XAxis).Range.Min) +
                  (double)IVar5.x);
  dVar3 = pGVar10->XScale;
  dVar4 = pGVar10->X0;
  dVar15 = log10(pGVar10->YRef / GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar20 = pTVar9->YAxis;
  pIVar11 = pIVar19->CurrentPlot;
  dVar14 = pIVar11->YAxis[iVar20].Range.Min;
  IVar5 = pIVar19->PixelRange[iVar20].Min;
  fVar21 = (float)(pIVar19->Mx * ((dVar4 + (double)prim * dVar3) - (pIVar11->XAxis).Range.Min) +
                  (double)IVar5.x);
  fVar22 = (float)(pIVar19->My[iVar20] *
                   ((dVar14 + (double)(float)(dVar15 / pIVar19->LogDenY[iVar20]) *
                              (pIVar11->YAxis[iVar20].Range.Max - dVar14)) - dVar14) +
                  (double)IVar5.y);
  auVar28._0_4_ = ~-(uint)(fVar21 <= fVar24) & (uint)fVar21;
  auVar28._4_4_ = ~-(uint)(fVar22 <= fVar23) & (uint)fVar22;
  auVar28._8_4_ = ~-(uint)(fVar24 < fVar21) & (uint)fVar21;
  auVar28._12_4_ = ~-(uint)(fVar23 < fVar22) & (uint)fVar22;
  auVar16._4_4_ = (uint)fVar23 & -(uint)(fVar22 <= fVar23);
  auVar16._0_4_ = (uint)fVar24 & -(uint)(fVar21 <= fVar24);
  auVar16._8_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar21);
  auVar16._12_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar22);
  auVar28 = auVar28 | auVar16;
  fVar25 = (cull_rect->Min).y;
  auVar30._4_4_ = -(uint)(fVar25 < auVar28._4_4_);
  auVar30._0_4_ = -(uint)((cull_rect->Min).x < auVar28._0_4_);
  auVar17._4_8_ = auVar28._8_8_;
  auVar17._0_4_ = -(uint)(auVar28._4_4_ < fVar25);
  auVar29._0_8_ = auVar17._0_8_ << 0x20;
  auVar29._8_4_ = -(uint)(auVar28._8_4_ < (cull_rect->Max).x);
  auVar29._12_4_ = -(uint)(auVar28._12_4_ < (cull_rect->Max).y);
  auVar30._8_8_ = auVar29._8_8_;
  iVar20 = movmskps((int)pIVar11,auVar30);
  if (iVar20 == 0xf) {
    IVar6 = this->Col;
    IVar5 = *uv;
    fVar25 = fVar21 - fVar24;
    fVar26 = fVar22 - fVar23;
    fVar27 = fVar25 * fVar25 + fVar26 * fVar26;
    if (0.0 < fVar27) {
      fVar27 = 1.0 / SQRT(fVar27);
      fVar25 = fVar25 * fVar27;
      fVar26 = fVar26 * fVar27;
    }
    fVar27 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar25 = fVar27 * fVar25;
    fVar27 = fVar27 * fVar26;
    (pIVar12->pos).x = fVar27 + fVar24;
    (pIVar12->pos).y = fVar23 - fVar25;
    (pIVar12->uv).x = IVar5.x;
    (pIVar12->uv).y = IVar5.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    pIVar12[1].pos.x = fVar27 + fVar21;
    pIVar12[1].pos.y = fVar22 - fVar25;
    pIVar12[1].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar6;
    pIVar12[2].pos.x = fVar21 - fVar27;
    pIVar12[2].pos.y = fVar22 + fVar25;
    pIVar12[2].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar6;
    pIVar12[3].pos.x = fVar24 - fVar27;
    pIVar12[3].pos.y = fVar25 + fVar23;
    pIVar12[3].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = uVar7;
    puVar13[1] = uVar7 + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar13[3] = uVar7;
    puVar13[4] = uVar7 + 2;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return (char)iVar20 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }